

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

Array<capnp::word> * __thiscall
capnp::messageToFlatArray
          (Array<capnp::word> *__return_storage_ptr__,capnp *this,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  size_t sVar1;
  word *pwVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *pAVar4;
  Array<capnp::word> *other;
  Fault local_90;
  Fault f;
  ArrayPtr<const_capnp::word> *segment;
  ArrayPtr<const_capnp::word> *__end1;
  ArrayPtr<const_capnp::word> *__begin1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *__range1;
  word *dst;
  uint i;
  WireValue<uint32_t> *table;
  undefined1 local_38 [8];
  Array<capnp::word> result;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  
  segments_00.size_ = (size_t)segments.ptr;
  segments_00.ptr = (ArrayPtr<const_capnp::word> *)this;
  result.disposer = (ArrayDisposer *)this;
  sVar1 = computeSerializedSizeInWords(segments_00);
  kj::heapArray<capnp::word>((Array<capnp::word> *)local_38,sVar1);
  pwVar2 = kj::Array<capnp::word>::begin((Array<capnp::word> *)local_38);
  sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  _::DirectWireValue<unsigned_int>::set((DirectWireValue<unsigned_int> *)pwVar2,(int)sVar1 - 1);
  dst._0_4_ = 0;
  while( true ) {
    sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
    if (sVar1 <= (uint)dst) break;
    pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer,
                        (ulong)(uint)dst);
    sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
    _::DirectWireValue<unsigned_int>::set
              ((DirectWireValue<unsigned_int> *)
               ((long)&pwVar2->content + (ulong)((uint)dst + 1) * 4),(uint)sVar1);
    dst._0_4_ = (uint)dst + 1;
  }
  sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  if ((sVar1 & 1) == 0) {
    sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
    _::DirectWireValue<unsigned_int>::set
              ((DirectWireValue<unsigned_int> *)((long)&pwVar2->content + sVar1 * 4 + 4),0);
  }
  pwVar2 = kj::Array<capnp::word>::begin((Array<capnp::word> *)local_38);
  sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  __range1 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)
             ((long)&pwVar2[1].content + (sVar1 & 0xfffffffffffffffe) * 4);
  __end1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::begin
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::end
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  for (; __end1 != pAVar3; __end1 = __end1 + 1) {
    f.exception = (Exception *)__end1;
    pwVar2 = kj::ArrayPtr<const_capnp::word>::begin(__end1);
    sVar1 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)f.exception);
    memcpy(__range1,pwVar2,sVar1 << 3);
    sVar1 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)f.exception);
    __range1 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)(&__range1->ptr + sVar1);
  }
  pAVar4 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)
           kj::Array<capnp::word>::end((Array<capnp::word> *)local_38);
  if (__range1 == pAVar4) {
    other = kj::mv<kj::Array<capnp::word>>((Array<capnp::word> *)local_38);
    kj::Array<capnp::word>::Array(__return_storage_ptr__,other);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_38);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
            (&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
             ,0x9a,FAILED,"dst == result.end()","\"Buffer overrun/underrun bug in code above.\"",
             (char (*) [43])"Buffer overrun/underrun bug in code above.");
  kj::_::Debug::Fault::fatal(&local_90);
}

Assistant:

kj::Array<word> messageToFlatArray(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  kj::Array<word> result = kj::heapArray<word>(computeSerializedSizeInWords(segments));

  _::WireValue<uint32_t>* table =
      reinterpret_cast<_::WireValue<uint32_t>*>(result.begin());

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);

  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }

  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  word* dst = result.begin() + segments.size() / 2 + 1;

  for (auto& segment: segments) {
    memcpy(dst, segment.begin(), segment.size() * sizeof(word));
    dst += segment.size();
  }

  KJ_DASSERT(dst == result.end(), "Buffer overrun/underrun bug in code above.");

  return kj::mv(result);
}